

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void rename_regs(gen_ctx_t gen_ctx)

{
  MIR_insn_t insn_00;
  int iVar1;
  bb_t_conflict pbVar2;
  bb_t_conflict local_68;
  bb_t_conflict bb_1;
  size_t i;
  bb_t_conflict bb;
  insn_var_iterator_t iter;
  ssa_edge_t_conflict ssa_edge;
  MIR_insn_t insn;
  MIR_reg_t var;
  int op_num;
  bb_insn_t_conflict bb_insn;
  gen_ctx_t gen_ctx_local;
  
  bb_insn = (bb_insn_t_conflict)gen_ctx;
  for (i = (size_t)DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); i != 0;
      i = (size_t)DLIST_bb_t_next((bb_t_conflict)i)) {
    for (_var = DLIST_bb_insn_t_head((DLIST_bb_insn_t *)(i + 0x50)); _var != (bb_insn_t_conflict)0x0
        ; _var = DLIST_bb_insn_t_next(_var)) {
      insn_00 = _var->insn;
      insn_var_iterator_init((insn_var_iterator_t *)&bb,insn_00);
      while (iVar1 = input_insn_var_iterator_next
                               ((gen_ctx_t)bb_insn,(insn_var_iterator_t *)&bb,(MIR_reg_t *)&insn,
                                (int *)((long)&insn + 4)), iVar1 != 0) {
        if ((0x21 < (uint)insn) &&
           (iVar1 = MIR_addr_code_p((MIR_insn_code_t)*(undefined8 *)&insn_00->field_0x18),
           iVar1 == 0)) {
          iter.op_part_num = (size_t)insn_00->ops[insn._4_4_].data;
          *(undefined1 *)(iter.op_part_num + 0x10) = 0;
        }
      }
    }
  }
  for (bb_1 = (bb_t_conflict)0x0;
      pbVar2 = (bb_t_conflict)
               VARR_bb_insn_tlength(*(VARR_bb_insn_t **)bb_insn[3].insn_dead_vars.tail),
      bb_1 < pbVar2; bb_1 = (bb_t_conflict)((long)&bb_1->index + 1)) {
    _var = VARR_bb_insn_tget(*(VARR_bb_insn_t **)bb_insn[3].insn_dead_vars.tail,(size_t)bb_1);
    if (_var != (bb_insn_t_conflict)0x0) {
      rename_bb_insn((gen_ctx_t)bb_insn,_var);
    }
  }
  for (local_68 = DLIST_bb_t_head((DLIST_bb_t *)&(bb_insn[3].insn)->field_0x18);
      local_68 != (bb_t_conflict)0x0; local_68 = DLIST_bb_t_next(local_68)) {
    for (_var = DLIST_bb_insn_t_head(&local_68->bb_insns); _var != (bb_insn_t_conflict)0x0;
        _var = DLIST_bb_insn_t_next(_var)) {
      rename_bb_insn((gen_ctx_t)bb_insn,_var);
    }
  }
  return;
}

Assistant:

static void rename_regs (gen_ctx_t gen_ctx) {
  bb_insn_t bb_insn;
  int op_num;
  MIR_reg_t var;
  MIR_insn_t insn;
  ssa_edge_t ssa_edge;
  insn_var_iterator_t iter;

  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) { /* clear all ssa edge flags */
      insn = bb_insn->insn;
      FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
        if (var <= MAX_HARD_REG || MIR_addr_code_p (insn->code)) continue;
        ssa_edge = insn->ops[op_num].data;
        ssa_edge->flag = FALSE;
      }
    }
  /* Process arg insns first to have first use of reg in the program with zero index.
     We need this because machinize for args will use reg with zero index: */
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, arg_bb_insns); i++)
    if ((bb_insn = VARR_GET (bb_insn_t, arg_bb_insns, i)) != NULL)
      rename_bb_insn (gen_ctx, bb_insn);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
      rename_bb_insn (gen_ctx, bb_insn);
}